

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_Server_run_shutdown(UA_Server *server)

{
  UA_ServerNetworkLayer *pUVar1;
  UA_Job *in_RAX;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  UA_Job *local_38;
  UA_Job *stopJobs;
  
  local_38 = in_RAX;
  if ((server->config).networkLayersSize != 0) {
    uVar3 = 0;
    do {
      pUVar1 = (server->config).networkLayers;
      local_38 = (UA_Job *)0x0;
      sVar2 = (*pUVar1[uVar3].stop)(pUVar1 + uVar3,&local_38);
      if (sVar2 != 0) {
        lVar4 = 0;
        do {
          processJob(server,(UA_Job *)((long)&local_38->type + lVar4));
          lVar4 = lVar4 + 0x20;
          sVar2 = sVar2 - 1;
        } while (sVar2 != 0);
      }
      free(local_38);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (server->config).networkLayersSize);
  }
  processDelayedCallbacks(server);
  return 0;
}

Assistant:

UA_StatusCode UA_Server_run_shutdown(UA_Server *server) {
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        UA_Job *stopJobs = NULL;
        size_t stopJobsSize = nl->stop(nl, &stopJobs);
        for(size_t j = 0; j < stopJobsSize; ++j)
            processJob(server, &stopJobs[j]);
        UA_free(stopJobs);
    }

#ifdef UA_ENABLE_MULTITHREADING
    /* Ensure that run_shutdown can be called multiple times */
    if(server->workers) {
        UA_LOG_INFO(server->config.logger, UA_LOGCATEGORY_SERVER,
                    "Shutting down %u worker thread(s)", server->config.nThreads);
        /* Wait for all worker threads to finish */
        for(size_t i = 0; i < server->config.nThreads; ++i)
            server->workers[i].running = false;
        pthread_cond_broadcast(&server->dispatchQueue_condition);
        for(size_t i = 0; i < server->config.nThreads; ++i)
            pthread_join(server->workers[i].thr, NULL);
        /* Free the worker structures */
        UA_free(server->workers);
        server->workers = NULL;
    }

    /* Manually finish the work still enqueued */
    emptyDispatchQueue(server);
    UA_ASSERT_RCU_UNLOCKED();
    rcu_barrier(); // wait for all scheduled call_rcu work to complete
#else
    processDelayedCallbacks(server);
#endif
    return UA_STATUSCODE_GOOD;
}